

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_storage.cpp
# Opt level: O1

void __thiscall
libtorrent::dht::anon_unknown_0::dht_default_storage::put_mutable_item
          (dht_default_storage *this,sha1_hash *target,span<const_char> buf,signature *sig,
          sequence_number seq,public_key *pk,span<const_char> salt,address *addr)

{
  int32_t *piVar1;
  _Rb_tree_header *p_Var2;
  size_t *psVar3;
  uint uVar4;
  undefined8 uVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  undefined8 uVar9;
  _Base_ptr p_Var10;
  size_t sVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  _Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>_>
  *this_00;
  _Rb_tree_node_base *p_Var15;
  _Rb_tree_node_base *p_Var16;
  byte bVar17;
  uint uVar18;
  long lVar21;
  vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *ids;
  _Rb_tree_node_base *p_Var22;
  byte bVar23;
  uchar *puVar25;
  _Link_type p_Var26;
  _Base_ptr *pp_Var27;
  uint uVar28;
  byte in_R10B;
  uint uVar29;
  _Rb_tree_node_base *p_Var30;
  undefined1 auVar31 [16];
  span<const_char> buf_00;
  span<const_char> buf_01;
  dht_mutable_item to_add;
  uint *local_288;
  _Base_ptr p_Stack_280;
  uint local_278;
  undefined4 uStack_274;
  _Base_ptr local_270;
  undefined1 local_268 [144];
  undefined1 local_1d8 [112];
  uchar local_168 [8];
  _Base_ptr local_160;
  _Base_ptr p_Stack_158;
  _Base_ptr local_150;
  undefined1 local_148 [144];
  uchar local_b8 [8];
  uchar auStack_b0 [8];
  uchar local_a8 [8];
  uchar auStack_a0 [8];
  uchar local_98 [8];
  uchar auStack_90 [8];
  uchar local_88 [8];
  undefined8 uStack_80;
  int64_t local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  _Base_ptr local_50;
  uchar local_48 [8];
  undefined1 local_40;
  undefined7 uStack_3f;
  _Base_ptr p_Stack_38;
  char *pcVar19;
  _Base_ptr p_Var20;
  sha1_hash *psVar24;
  
  buf_00.m_len = (char *)buf.m_len;
  bVar17 = 0;
  p_Var2 = &(this->m_mutable_table)._M_t._M_impl.super__Rb_tree_header;
  p_Var22 = (this->m_mutable_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var15 = &p_Var2->_M_header;
  psVar24 = target;
  for (; p_Var22 != (_Rb_tree_node_base *)0x0;
      p_Var22 = *(_Rb_tree_node_base **)((long)&p_Var22->_M_color + lVar21)) {
    lVar21 = 0x20;
    do {
      uVar18 = *(uint *)((long)&p_Var22->_M_color + lVar21);
      uVar28 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
      uVar4 = *(uint *)((long)(target->m_number)._M_elems + lVar21 + -0x20);
      uVar29 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      in_R10B = uVar28 < uVar29;
      bVar23 = (byte)psVar24 & uVar28 <= uVar29 | in_R10B;
      psVar24 = (sha1_hash *)(ulong)bVar23;
      if (uVar18 != uVar4) {
        lVar21 = (ulong)bVar23 * 8 + 0x10;
        if (bVar23 == 0) {
          p_Var15 = p_Var22;
        }
        goto LAB_003b838e;
      }
      lVar21 = lVar21 + 4;
    } while (lVar21 != 0x34);
    lVar21 = 0x10;
    p_Var15 = p_Var22;
LAB_003b838e:
    psVar24 = (sha1_hash *)(ulong)bVar23;
  }
  p_Var22 = &p_Var2->_M_header;
  if ((_Rb_tree_header *)p_Var15 != p_Var2) {
    lVar21 = 0x20;
    do {
      uVar18 = *(uint *)((long)(target->m_number)._M_elems + lVar21 + -0x20);
      uVar28 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
      uVar4 = *(uint *)((long)&p_Var15->_M_color + lVar21);
      uVar29 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      in_R10B = in_R10B & uVar28 <= uVar29 | uVar28 < uVar29;
      if (uVar18 != uVar4) {
        if (in_R10B != 0) goto LAB_003b83e4;
        break;
      }
      lVar21 = lVar21 + 4;
    } while (lVar21 != 0x34);
    p_Var22 = p_Var15;
  }
LAB_003b83e4:
  if ((_Rb_tree_header *)p_Var22 != p_Var2) {
    if ((long)p_Var22[8]._M_left < seq.value) {
      buf_00.m_ptr = buf_00.m_len;
      set_value((anon_unknown_0 *)&p_Var22[1]._M_right,(dht_immutable_item *)buf.m_ptr,buf_00);
      p_Var22[8]._M_left = (_Base_ptr)seq.value;
      p_Var20 = *(_Base_ptr *)((sig->bytes)._M_elems + 8);
      uVar5 = *(undefined8 *)((sig->bytes)._M_elems + 0x10);
      p_Var6 = *(_Base_ptr *)((sig->bytes)._M_elems + 0x18);
      p_Var7 = *(_Base_ptr *)((sig->bytes)._M_elems + 0x20);
      p_Var8 = *(_Base_ptr *)((sig->bytes)._M_elems + 0x28);
      uVar9 = *(undefined8 *)((sig->bytes)._M_elems + 0x30);
      p_Var10 = *(_Base_ptr *)((sig->bytes)._M_elems + 0x38);
      p_Var22[6]._M_left = *(_Base_ptr *)(sig->bytes)._M_elems;
      p_Var22[6]._M_right = p_Var20;
      *(undefined8 *)(p_Var22 + 7) = uVar5;
      p_Var22[7]._M_parent = p_Var6;
      p_Var22[7]._M_left = p_Var7;
      p_Var22[7]._M_right = p_Var8;
      *(undefined8 *)(p_Var22 + 8) = uVar9;
      p_Var22[8]._M_parent = p_Var10;
    }
    goto LAB_003b8926;
  }
  sVar11 = (this->m_mutable_table)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pcVar19 = buf_00.m_len;
  iVar13 = (*this->m_settings->_vptr_settings_interface[5])();
  if (iVar13 <= (int)sVar11) {
    p_Var22 = (this->m_mutable_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (((_Rb_tree_header *)p_Var22 != p_Var2) &&
       (auVar31 = ::std::_Rb_tree_increment(p_Var22), (_Rb_tree_header *)auVar31._0_8_ != p_Var2)) {
      do {
        p_Var15 = auVar31._0_8_;
        iVar13 = min_distance_exp((dht *)(p_Var15 + 1),(node_id *)&this->m_node_ids,auVar31._8_8_);
        iVar14 = min_distance_exp((dht *)(p_Var22 + 1),(node_id *)&this->m_node_ids,ids);
        uVar18 = *(int *)&p_Var15[6]._M_parent / 5 - iVar13;
        pcVar19 = (char *)(ulong)uVar18;
        if ((int)uVar18 < *(int *)&p_Var22[6]._M_parent / 5 - iVar14) {
          p_Var22 = p_Var15;
        }
        auVar31 = ::std::_Rb_tree_increment(p_Var15);
      } while ((_Rb_tree_header *)auVar31._0_8_ != p_Var2);
    }
    p_Var26 = (_Link_type)p_Var2;
    this_00 = (_Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>_>
               *)::std::_Rb_tree_rebalance_for_erase(p_Var22,&p_Var2->_M_header);
    ::std::
    _Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>_>
    ::_M_drop_node(this_00,p_Var26);
    psVar3 = &(this->m_mutable_table)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar3 = *psVar3 - 1;
    piVar1 = &(this->m_counters).mutable_data;
    *piVar1 = *piVar1 + -1;
  }
  memset((anon_unknown_0 *)&local_150,0,0x100);
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_40 = _S_red;
  buf_01.m_len = (difference_type)pcVar19;
  buf_01.m_ptr = buf_00.m_len;
  local_50 = (_Base_ptr)&local_40;
  set_value((anon_unknown_0 *)&local_150,(dht_immutable_item *)buf.m_ptr,buf_01);
  local_288 = &local_278;
  local_78 = seq.value;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_288,salt.m_ptr,salt.m_ptr + salt.m_len);
  ::std::__cxx11::string::operator=((string *)&local_50,(string *)&local_288);
  if (local_288 != &local_278) {
    operator_delete(local_288,CONCAT44(uStack_274,local_278) + 1);
  }
  local_b8 = *(uchar (*) [8])(sig->bytes)._M_elems;
  auStack_b0 = *(uchar (*) [8])((sig->bytes)._M_elems + 8);
  local_a8 = *(uchar (*) [8])((sig->bytes)._M_elems + 0x10);
  auStack_a0 = *(uchar (*) [8])((sig->bytes)._M_elems + 0x18);
  local_98 = *(uchar (*) [8])((sig->bytes)._M_elems + 0x20);
  auStack_90 = *(uchar (*) [8])((sig->bytes)._M_elems + 0x28);
  local_88 = *(uchar (*) [8])((sig->bytes)._M_elems + 0x30);
  uStack_80 = *(undefined8 *)((sig->bytes)._M_elems + 0x38);
  local_70 = *(undefined8 *)(pk->bytes)._M_elems;
  uStack_68 = *(undefined8 *)((pk->bytes)._M_elems + 8);
  local_60 = *(undefined8 *)((pk->bytes)._M_elems + 0x10);
  uStack_58 = *(undefined8 *)((pk->bytes)._M_elems + 0x18);
  local_278 = (target->m_number)._M_elems[4];
  local_288 = *(uint **)(target->m_number)._M_elems;
  p_Stack_280 = *(_Base_ptr *)((target->m_number)._M_elems + 2);
  local_270 = local_150;
  local_150 = (_Base_ptr)0x0;
  memcpy(local_268,local_148,0x90);
  puVar25 = local_b8;
  p_Var26 = (_Link_type)local_1d8;
  for (lVar21 = 0xd; lVar21 != 0; lVar21 = lVar21 + -1) {
    *(undefined8 *)&p_Var26->super__Rb_tree_node_base = *(undefined8 *)puVar25;
    puVar25 = puVar25 + ((ulong)bVar17 * -2 + 1) * 8;
    p_Var26 = (_Link_type)((long)p_Var26 + (ulong)bVar17 * -0x10 + 8);
  }
  if (local_50 == (_Base_ptr)&local_40) {
    p_Stack_158 = p_Stack_38;
    local_1d8._104_8_ = (_Base_ptr)&local_160;
  }
  else {
    local_1d8._104_8_ = local_50;
  }
  local_160 = (_Base_ptr)CONCAT71(uStack_3f,local_40);
  local_168[0] = local_48[0];
  local_168[1] = local_48[1];
  local_168[2] = local_48[2];
  local_168[3] = local_48[3];
  local_168[4] = local_48[4];
  local_168[5] = local_48[5];
  local_168[6] = local_48[6];
  local_168[7] = local_48[7];
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_40 = _S_red;
  local_50 = (_Base_ptr)&local_40;
  p_Var15 = (_Rb_tree_node_base *)operator_new(0x158);
  *(uint *)&p_Var15[1]._M_left = local_278;
  *(uint **)(p_Var15 + 1) = local_288;
  p_Var15[1]._M_parent = p_Stack_280;
  p_Var15[1]._M_right = local_270;
  local_270 = (_Base_ptr)0x0;
  memcpy(p_Var15 + 2,local_268,0x90);
  p_Var26 = (_Link_type)local_1d8;
  pp_Var27 = &p_Var15[6]._M_left;
  for (lVar21 = 0xd; lVar21 != 0; lVar21 = lVar21 + -1) {
    *pp_Var27 = *(_Base_ptr *)&p_Var26->super__Rb_tree_node_base;
    p_Var26 = (_Link_type)((long)p_Var26 + (ulong)bVar17 * -0x10 + 8);
    pp_Var27 = pp_Var27 + (ulong)bVar17 * -2 + 1;
  }
  p_Var15[9]._M_right = (_Base_ptr)&p_Var15[10]._M_parent;
  if ((_Base_ptr)local_1d8._104_8_ == (_Base_ptr)&local_160) {
    p_Var15[10]._M_parent = local_160;
    p_Var15[10]._M_left = p_Stack_158;
  }
  else {
    p_Var15[9]._M_right = (_Base_ptr)local_1d8._104_8_;
    p_Var15[10]._M_parent = local_160;
  }
  *(uchar (*) [8])(p_Var15 + 10) = local_168;
  local_168[0] = '\0';
  local_168[1] = '\0';
  local_168[2] = '\0';
  local_168[3] = '\0';
  local_168[4] = '\0';
  local_168[5] = '\0';
  local_168[6] = '\0';
  local_168[7] = '\0';
  local_160 = (_Base_ptr)((ulong)local_160 & 0xffffffffffffff00);
  p_Var22 = (this->m_mutable_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var22 == (_Rb_tree_node_base *)0x0) {
    p_Var20 = (_Base_ptr)0x1;
    p_Var30 = &p_Var2->_M_header;
  }
  else {
    do {
      p_Var30 = p_Var22;
      lVar21 = 0x20;
      do {
        uVar18 = *(uint *)((long)&p_Var15->_M_color + lVar21);
        uVar28 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18
        ;
        uVar4 = *(uint *)((long)&p_Var30->_M_color + lVar21);
        uVar29 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        p_Var26 = (_Link_type)(ulong)CONCAT31((int3)(uVar28 >> 8),uVar28 <= uVar29);
        local_1d8._104_8_ =
             ZEXT18((byte)((byte)local_1d8._104_8_ & uVar28 <= uVar29 | uVar28 < uVar29));
        if (uVar18 != uVar4) goto LAB_003b87de;
        lVar21 = lVar21 + 4;
      } while (lVar21 != 0x34);
      local_1d8._104_8_ = (_Base_ptr)0x0;
LAB_003b87de:
      p_Var22 = (&p_Var30->_M_left)[(byte)((byte)local_1d8._104_8_ ^ 1)];
      p_Var20 = (_Base_ptr)local_1d8._104_8_;
    } while (p_Var22 != (_Base_ptr)0x0);
  }
  p_Var16 = p_Var30;
  local_1d8._104_8_ = (_Base_ptr)&local_160;
  if ((char)p_Var20 == '\0') {
LAB_003b880f:
    lVar21 = 0x20;
    do {
      uVar18 = *(uint *)((long)&p_Var16->_M_color + lVar21);
      p_Var26 = (_Link_type)(ulong)uVar18;
      uVar28 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
      uVar4 = *(uint *)((long)&p_Var15->_M_color + lVar21);
      uVar29 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      bVar17 = (byte)p_Var20 & uVar28 <= uVar29 | uVar28 < uVar29;
      p_Var20 = (_Base_ptr)(ulong)bVar17;
      if (uVar18 != uVar4) goto LAB_003b8847;
      lVar21 = lVar21 + 4;
    } while (lVar21 != 0x34);
    bVar17 = 0;
LAB_003b8847:
    if (bVar17 == 0) {
      p_Var22 = p_Var16;
      p_Var30 = (_Rb_tree_node_base *)0x0;
    }
  }
  else if (p_Var30 != (this->m_mutable_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
  {
    p_Var16 = (_Rb_tree_node_base *)::std::_Rb_tree_decrement(p_Var30);
    goto LAB_003b880f;
  }
  if (p_Var30 == (_Rb_tree_node_base *)0x0) {
    ::std::
    _Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>_>
    ::_M_drop_node((_Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>_>
                    *)p_Var15,p_Var26);
  }
  else {
    bVar12 = true;
    if ((p_Var22 == (_Rb_tree_node_base *)0x0) && (p_Var2 != (_Rb_tree_header *)p_Var30)) {
      lVar21 = 0;
      do {
        uVar18 = *(uint *)((long)&p_Var15[1]._M_color + lVar21);
        uVar28 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18
        ;
        uVar4 = *(uint *)((long)&p_Var30[1]._M_color + lVar21);
        uVar29 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        bVar12 = (bool)(bVar12 & uVar28 <= uVar29 | uVar28 < uVar29);
        if (uVar18 != uVar4) goto LAB_003b88a2;
        lVar21 = lVar21 + 4;
      } while (lVar21 != 0x14);
      bVar12 = false;
    }
LAB_003b88a2:
    ::std::_Rb_tree_insert_and_rebalance(bVar12,p_Var15,p_Var30,&p_Var2->_M_header);
    psVar3 = &(this->m_mutable_table)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar3 = *psVar3 + 1;
    p_Var22 = p_Var15;
  }
  if ((_Base_ptr)local_1d8._104_8_ != (_Base_ptr)&local_160) {
    operator_delete((void *)local_1d8._104_8_,(long)local_160 + 1);
  }
  if (local_270 != (_Base_ptr)0x0) {
    operator_delete__(local_270);
  }
  piVar1 = &(this->m_counters).mutable_data;
  *piVar1 = *piVar1 + 1;
  if (local_50 != (_Base_ptr)&local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  if (local_150 != (_Base_ptr)0x0) {
    operator_delete__(local_150);
  }
LAB_003b8926:
  touch_item((dht_immutable_item *)&p_Var22[1]._M_right,addr);
  return;
}

Assistant:

void put_mutable_item(sha1_hash const& target
			, span<char const> buf
			, signature const& sig
			, sequence_number const seq
			, public_key const& pk
			, span<char const> salt
			, address const& addr) override
		{
			TORRENT_ASSERT(!m_node_ids.empty());
			auto i = m_mutable_table.find(target);
			if (i == m_mutable_table.end())
			{
				// this is the case where we don't have an item in this slot
				// make sure we don't add too many items
				if (int(m_mutable_table.size()) >= m_settings.get_int(settings_pack::dht_max_dht_items))
				{
					auto const j = pick_least_important_item(m_node_ids
						, m_mutable_table);

					TORRENT_ASSERT(j != m_mutable_table.end());
					m_mutable_table.erase(j);
					m_counters.mutable_data -= 1;
				}
				dht_mutable_item to_add;
				set_value(to_add, buf);
				to_add.seq = seq;
				to_add.salt = {salt.begin(), salt.end()};
				to_add.sig = sig;
				to_add.key = pk;

				std::tie(i, std::ignore) = m_mutable_table.insert(
					std::make_pair(target, std::move(to_add)));
				m_counters.mutable_data += 1;
			}
			else
			{
				// this is the case where we already have an item in this slot
				dht_mutable_item& item = i->second;

				if (item.seq < seq)
				{
					set_value(item, buf);
					item.seq = seq;
					item.sig = sig;
				}
			}

			touch_item(i->second, addr);
		}